

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

void * __thiscall tinyxml2::MemPoolT<72>::Alloc(MemPoolT<72> *this)

{
  Chunk *pCVar1;
  void *result;
  int i;
  Block *block;
  MemPoolT<72> *this_local;
  
  if (this->_root == (Chunk *)0x0) {
    pCVar1 = (Chunk *)operator_new(0xfc0);
    memset(pCVar1,0,0xfc0);
    DynArray<tinyxml2::MemPoolT<72>::Block_*,_10>::Push(&this->_blockPtrs,(Block *)pCVar1);
    for (result._4_4_ = 0; result._4_4_ < 0x37; result._4_4_ = result._4_4_ + 1) {
      pCVar1[result._4_4_].next = pCVar1 + (result._4_4_ + 1);
    }
    pCVar1[0x37].next = (Chunk *)0x0;
    this->_root = pCVar1;
  }
  pCVar1 = this->_root;
  this->_root = this->_root->next;
  this->_currentAllocs = this->_currentAllocs + 1;
  if (this->_maxAllocs < this->_currentAllocs) {
    this->_maxAllocs = this->_currentAllocs;
  }
  this->_nAllocs = this->_nAllocs + 1;
  this->_nUntracked = this->_nUntracked + 1;
  return pCVar1;
}

Assistant:

virtual void* Alloc() {
        if ( !_root ) {
            // Need a new block.
            Block* block = new Block();
            _blockPtrs.Push( block );

            for( int i=0; i<COUNT-1; ++i ) {
                block->chunk[i].next = &block->chunk[i+1];
            }
            block->chunk[COUNT-1].next = 0;
            _root = block->chunk;
        }
        void* result = _root;
        _root = _root->next;

        ++_currentAllocs;
        if ( _currentAllocs > _maxAllocs ) {
            _maxAllocs = _currentAllocs;
        }
        _nAllocs++;
        _nUntracked++;
        return result;
    }